

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue.cpp
# Opt level: O0

bool __thiscall UniValue::setFloat(UniValue *this,double val_)

{
  bool bVar1;
  ostream *this_00;
  string local_1c8;
  undefined1 local_1a5;
  bool ret;
  int local_194;
  ostringstream local_190 [8];
  ostringstream oss;
  double val__local;
  UniValue *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_194 = (int)std::setprecision(0x10);
  this_00 = std::operator<<((ostream *)local_190,(_Setprecision)local_194);
  std::ostream::operator<<(this_00,val_);
  std::__cxx11::ostringstream::str();
  bVar1 = setNumStr(this,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  this->typ = VNUM;
  local_1a5 = bVar1;
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return bVar1;
}

Assistant:

bool UniValue::setFloat(double val_)
{
    std::ostringstream oss;

    oss << std::setprecision(16) << val_;

    bool ret = setNumStr(oss.str());
    typ = VNUM;
    return ret;
}